

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void Map_Push(Map *tree,void *str,size_t size,void *id)

{
  void *pvVar1;
  void *local_30;
  size_t temp;
  void *id_local;
  size_t size_local;
  void *str_local;
  Map *tree_local;
  
  temp = (size_t)id;
  id_local = (void *)size;
  size_local = (size_t)str;
  str_local = tree;
  Map_Scour(tree,str,size,(size_t *)&local_30,(Map **)&str_local);
  if (local_30 == id_local) {
    if (*(long *)((long)str_local + 0x808) != 0) {
      __assert_fail("tree->ID==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/map.c"
                    ,0x29,"void Map_Push(Map *, void *, size_t, void *)");
    }
    *(size_t *)((long)str_local + 0x808) = temp;
    *(undefined1 *)str_local = 1;
  }
  else {
    for (; local_30 < id_local; local_30 = (void *)((long)local_30 + 1)) {
      pvVar1 = calloc(1,0x810);
      *(void **)((long)str_local + (ulong)*(byte *)(size_local + (long)local_30) * 8 + 8) = pvVar1;
      str_local = pvVar1;
    }
    *(size_t *)((long)str_local + 0x808) = temp;
    *(undefined1 *)str_local = 1;
  }
  return;
}

Assistant:

void Map_Push(Map *tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		assert(tree->ID==NULL);
		tree->ID=id;
		tree->is_final=1;
		return;
	}
	for(temp;temp<size;++temp)
	{
		tree=tree->delta[((unsigned char*)str)[temp]]=calloc(1,sizeof(Map));
		/*
		Map_Init(
			tree=tree->delta[((unsigned char*)str)[temp]]=malloc(sizeof(Map))
			);
			*/
	}

	tree->ID=id;
	tree->is_final=1;

}